

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdDecompose_rec
               (Kit_DsdNtk_t *pNtk,Kit_DsdObj_t *pObj,uint uSupp,unsigned_short *pPar,int nDecMux)

{
  uint *pOut;
  uint *pOut_00;
  uint *pOut_01;
  uint *pOut_02;
  Kit_DsdObj_t *pPar_00;
  Kit_DsdObj_t KVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  Kit_DsdObj_t *pKVar9;
  Kit_DsdObj_t *pKVar10;
  undefined1 *puVar11;
  byte bVar12;
  ushort uVar13;
  undefined2 uVar14;
  uint uVar15;
  long lVar16;
  undefined4 *puVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  uint *pOut_03;
  int i_1;
  uint uVar25;
  undefined2 uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int i;
  int iVar36;
  ulong uVar37;
  uint *pTruth;
  bool bVar38;
  uint local_c0;
  int local_b0;
  int local_68;
  ulong uVar24;
  
  do {
    pPar_00 = pObj + 1;
    local_c0 = uSupp;
LAB_005d19cf:
    KVar1 = *pObj;
    bVar12 = (KVar1._3_1_ >> 2) - 5;
    iVar5 = 5 << (bVar12 & 0x1f);
    if ((uint)KVar1 < 0x18000000) {
      iVar5 = 5;
    }
    iVar27 = 3 << (bVar12 & 0x1f);
    if ((uint)KVar1 < 0x18000000) {
      iVar27 = 3;
    }
    iVar22 = 1 << (bVar12 & 0x1f);
    if ((uint)KVar1 < 0x18000000) {
      iVar22 = 1;
    }
    pTruth = (uint *)((long)&pObj[1].field_0x0 + (ulong)((uint)KVar1 >> 8 & 0x3fc));
    if (((uint)KVar1 & 0x1c0) != 0x140) {
      pTruth = (uint *)0x0;
    }
    if ((uint)KVar1 < 0x4000000) {
      __assert_fail("pObj->nFans > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x7be,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    if (((uint)KVar1 & 0x1c0) != 0x140) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x7bf,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    puVar8 = pNtk->pMem;
    uVar4 = Kit_TruthSupport(pTruth,(uint)KVar1 >> 0x1a);
    if (uVar4 != local_c0) {
      __assert_fail("uSupp == (uSupp0 = (unsigned)Kit_TruthSupport(pTruth, pObj->nFans))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x7c0,
                    "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                   );
    }
    KVar1 = *pObj;
    if (0x83ffffff < (uint)KVar1) {
LAB_005d2cfd:
      __assert_fail("nBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                    ,0xe4,"unsigned int Kit_BitMask(int)");
    }
    if ((-1 << (KVar1._3_1_ >> 2 & 0x1f) ^ local_c0) != 0xffffffff) {
      uVar4 = (local_c0 >> 1 & 0x55555555) + (local_c0 & 0x55555555);
      uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
      uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
      uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
      uVar25 = (uVar4 >> 0x10) + (uVar4 & 0xffff);
      Kit_TruthShrink(pNtk->pMem,pTruth,uVar25,(uint)KVar1 >> 0x1a,local_c0,1);
      KVar1 = *pObj;
      uVar4 = 0;
      if (0x3ffffff < (uint)KVar1) {
        uVar29 = 0;
        uVar4 = 0;
        do {
          if ((local_c0 >> ((uint)uVar29 & 0x1f) & 1) != 0) {
            uVar37 = (ulong)uVar4;
            uVar4 = uVar4 + 1;
            *(undefined2 *)((long)&pObj[1].field_0x0 + uVar37 * 2) =
                 *(undefined2 *)((long)&pObj[1].field_0x0 + uVar29 * 2);
          }
          uVar29 = uVar29 + 1;
        } while ((uint)KVar1 >> 0x1a != uVar29);
      }
      if (uVar4 != uVar25) {
        __assert_fail("k == nFansNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x7ca,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      *pObj = (Kit_DsdObj_t)((uint)KVar1 & 0x3ffffff | uVar4 << 0x1a);
      if (0x20 < (uVar4 & 0x3f)) goto LAB_005d2cfd;
      local_c0 = ~(-1 << ((byte)(uVar4 & 0x3f) & 0x1f));
    }
    KVar1 = *pObj;
    uVar4 = (uint)KVar1 >> 0x1a;
    if (uVar4 == 1) {
      *pObj = (Kit_DsdObj_t)((uint)KVar1 & 0x7fffe3f);
      if (*pTruth != 0xaaaaaaaa) {
        if (*pTruth != 0x55555555) {
          __assert_fail("pTruth[0] == 0xAAAAAAAA",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                        ,0x7d6,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
        *(byte *)pPar_00 = *(byte *)pPar_00 ^ 1;
      }
      *pPar = *pPar & 1 ^ *(ushort *)pPar_00;
      return;
    }
    pOut = puVar8 + iVar22;
    if (((uint)KVar1 >> 9 & 1) == 0) {
LAB_005d1bb4:
      if ((int)uVar4 < 1) goto LAB_005d1d58;
      uVar4 = uVar4 - 1;
      Kit_TruthCofactor0New(puVar8,pTruth,(uint)*pObj >> 0x1a,uVar4);
      Kit_TruthCofactor1New(pOut,pTruth,(uint)*pObj >> 0x1a,uVar4);
      KVar1 = *pObj;
      uVar25 = 1 << ((KVar1._3_1_ >> 2) - 5 & 0x1f);
      if ((uint)KVar1 < 0x18000000) {
        uVar25 = 1;
      }
      uVar37 = (ulong)uVar25;
      uVar29 = uVar37;
      do {
        iVar7 = (int)uVar29;
        uVar24 = uVar37;
        if (iVar7 < 1) {
          local_b0 = 1;
          goto LAB_005d1c3f;
        }
        lVar18 = uVar29 - 1;
        uVar29 = uVar29 - 1;
      } while (puVar8[lVar18] == 0);
      local_b0 = 0;
LAB_005d1c3f:
      do {
        iVar19 = (int)uVar24;
        uVar29 = uVar37;
        if (iVar19 < 1) {
          iVar20 = 1;
          goto LAB_005d1c5c;
        }
        lVar18 = uVar24 - 1;
        uVar24 = uVar24 - 1;
      } while (pOut[lVar18] == 0);
      iVar20 = 0;
LAB_005d1c5c:
      do {
        iVar31 = (int)uVar29;
        uVar24 = uVar37;
        if (iVar31 < 1) {
          iVar32 = 1;
          goto LAB_005d1c7b;
        }
        lVar18 = uVar29 - 1;
        uVar29 = uVar29 - 1;
      } while (puVar8[lVar18] == 0xffffffff);
      iVar32 = 0;
LAB_005d1c7b:
      do {
        iVar33 = (int)uVar24;
        uVar29 = uVar37;
        if (iVar33 < 1) {
          iVar34 = 1;
          goto LAB_005d1ca0;
        }
        lVar18 = uVar24 - 1;
        uVar24 = uVar24 - 1;
      } while (pOut[lVar18] == 0xffffffff);
      iVar34 = 0;
LAB_005d1ca0:
      do {
        iVar35 = (int)uVar29;
        if (iVar35 < 1) {
          bVar38 = true;
          goto LAB_005d1cc5;
        }
        lVar18 = uVar29 - 1;
        lVar16 = uVar29 - 1;
        uVar29 = uVar29 - 1;
      } while ((pOut[lVar18] ^ puVar8[lVar16]) == 0xffffffff);
      bVar38 = false;
LAB_005d1cc5:
      do {
        iVar36 = (int)uVar37;
        if (iVar36 < 1) goto LAB_005d2c81;
        lVar18 = uVar37 - 1;
        lVar16 = uVar37 - 1;
        uVar37 = uVar37 - 1;
      } while (puVar8[lVar18] == pOut[lVar16]);
      if (iVar36 < 1) {
LAB_005d2c81:
        __assert_fail("!Kit_TruthIsEqual(pCofs2[0], pCofs2[1], pObj->nFans)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x7eb,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      if (bVar38 || iVar32 + iVar34 + iVar20 + local_b0 != 0) {
        pKVar9 = Kit_DsdObjAlloc(pNtk,KIT_DSD_AND,2);
        *pKVar9 = (Kit_DsdObj_t)
                  (((uint)*pKVar9 & 0x3ffff) + ((int)*pKVar9 + 0x40000U & 0x3fc0000) + 0x8000000);
        *(undefined2 *)(pKVar9 + 1) = *(undefined2 *)((long)&pObj[1].field_0x0 + (ulong)uVar4 * 2);
        *(undefined2 *)((long)&pObj[1].field_0x0 + (ulong)uVar4 * 2) = 0x7f;
        puVar11 = &pKVar9[1].field_0x2;
        *(ushort *)&pKVar9[1].field_0x2 = SUB42(*pObj,0) * 2 & 0x7e;
        uVar13 = (*pPar & 1) + (SUB42(*pKVar9,0) & 0x3f) * 2;
        *pPar = uVar13;
        if (iVar7 < 1) {
          uVar25 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar25 = 1;
          }
          if (0 < (int)uVar25) {
            lVar18 = (ulong)uVar25 + 1;
            do {
              pTruth[lVar18 + -2] = pOut[lVar18 + -2];
              lVar18 = lVar18 + -1;
            } while (1 < lVar18);
          }
        }
        else if (iVar19 < 1) {
          *(byte *)(pKVar9 + 1) = *(byte *)(pKVar9 + 1) ^ 1;
          uVar25 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar25 = 1;
          }
          if (0 < (int)uVar25) {
            lVar18 = (ulong)uVar25 + 1;
            do {
              pTruth[lVar18 + -2] = puVar8[lVar18 + -2];
              lVar18 = lVar18 + -1;
            } while (1 < lVar18);
          }
        }
        else if (iVar31 < 1) {
          *pPar = uVar13 ^ 1;
          *puVar11 = *puVar11 ^ 1;
          uVar25 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar25 = 1;
          }
          if (0 < (int)uVar25) {
            lVar18 = (ulong)uVar25 + 1;
            do {
              pTruth[lVar18 + -2] = pOut[lVar18 + -2];
              lVar18 = lVar18 + -1;
            } while (1 < lVar18);
          }
        }
        else if (iVar33 < 1) {
          *pPar = uVar13 ^ 1;
          *(byte *)(pKVar9 + 1) = *(byte *)(pKVar9 + 1) ^ 1;
          pKVar9[1].field_0x2 = pKVar9[1].field_0x2 ^ 1;
          uVar25 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar25 = 1;
          }
          if (0 < (int)uVar25) {
            lVar18 = (ulong)uVar25 + 1;
            do {
              pTruth[lVar18 + -2] = puVar8[lVar18 + -2];
              lVar18 = lVar18 + -1;
            } while (1 < lVar18);
          }
        }
        else {
          if (0 < iVar35) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                          ,0x830,
                          "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                         );
          }
          *pKVar9 = (Kit_DsdObj_t)((uint)*pKVar9 & 0xfffffe3f | 0x100);
          uVar25 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
          if ((uint)*pObj < 0x18000000) {
            uVar25 = 1;
          }
          if (0 < (int)uVar25) {
            lVar18 = (ulong)uVar25 + 1;
            do {
              pTruth[lVar18 + -2] = puVar8[lVar18 + -2];
              lVar18 = lVar18 + -1;
            } while (1 < lVar18);
          }
        }
        local_c0 = local_c0 & ~(1 << (uVar4 & 0x1f));
        puVar8 = (uint *)((long)&pPar_00->field_0x0 + (ulong)((uint)*pObj >> 8 & 0x3fc));
        if (((uint)*pObj & 0x1c0) != 0x140) {
          puVar8 = (uint *)0x0;
        }
        pPar = (unsigned_short *)puVar11;
        if (puVar8 != pTruth) {
          __assert_fail("Kit_DsdObjTruth(pObj) == pTruth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                        ,0x832,
                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                       );
        }
        goto LAB_005d19cf;
      }
      uVar25 = Kit_TruthSupport(puVar8,(uint)KVar1 >> 0x1a);
      uSupp = Kit_TruthSupport(pOut,(uint)*pObj >> 0x1a);
      if (local_c0 != (uVar25 | 1 << (uVar4 & 0x1f) | uSupp)) {
        __assert_fail("uSupp == (uSupp0 | uSupp1 | (1<<i))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x7f1,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      if ((uSupp & uVar25) != 0) goto LAB_005d1bb4;
      pKVar9 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      pKVar10 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      if ((uint)*pObj < 0x4000000) {
        uVar37 = (ulong)((uint)*pObj >> 0x1a);
        bVar38 = true;
      }
      else {
        uVar29 = 0;
        do {
          uVar14 = 0x7f;
          uVar26 = 0x7f;
          if ((uVar25 >> ((uint)uVar29 & 0x1f) & 1) != 0) {
            uVar26 = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar29 * 2);
          }
          *(undefined2 *)(&pKVar9[1].field_0x0 + uVar29 * 2) = uVar26;
          if ((1 << ((byte)uVar29 & 0x1f) & uSupp) != 0) {
            uVar14 = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar29 * 2);
          }
          *(undefined2 *)(&pKVar10[1].field_0x0 + uVar29 * 2) = uVar14;
          uVar29 = uVar29 + 1;
          uVar37 = (ulong)((uint)*pObj >> 0x1a);
        } while (uVar29 < uVar37);
        bVar38 = (uint)*pObj < 0x18000000;
      }
      puVar11 = &pKVar9[1].field_0x0 + ((uint)*pKVar9 >> 8 & 0x3fc);
      if (((uint)*pKVar9 & 0x1c0) != 0x140) {
        puVar11 = (undefined1 *)0x0;
      }
      uVar28 = 1 << ((char)uVar37 - 5U & 0x1f);
      if (bVar38) {
        uVar28 = 1;
      }
      if (0 < (int)uVar28) {
        lVar18 = (ulong)uVar28 + 1;
        do {
          *(uint *)(puVar11 + lVar18 * 4 + -8) = puVar8[lVar18 + -2];
          lVar18 = lVar18 + -1;
        } while (1 < lVar18);
      }
      puVar11 = &pKVar10[1].field_0x0 + ((uint)*pKVar10 >> 8 & 0x3fc);
      if (((uint)*pKVar10 & 0x1c0) != 0x140) {
        puVar11 = (undefined1 *)0x0;
      }
      uVar28 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
      if ((uint)*pObj < 0x18000000) {
        uVar28 = 1;
      }
      if (0 < (int)uVar28) {
        lVar18 = (ulong)uVar28 + 1;
        do {
          *(uint *)(puVar11 + lVar18 * 4 + -8) = pOut[lVar18 + -2];
          lVar18 = lVar18 + -1;
        } while (1 < lVar18);
      }
      KVar1 = *pObj;
      if (((uint)KVar1 & 0x1c0) != 0x140) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x7ff,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      *pTruth = 0xcacacaca;
      *pObj = (Kit_DsdObj_t)((uint)KVar1 & 0x3ffff7f | 0xc000000);
      *(undefined2 *)(pObj + 2) = *(undefined2 *)((long)&pObj[1].field_0x0 + (ulong)uVar4 * 2);
      *(ushort *)(pObj + 1) = SUB42(*pKVar9,0) * 2 & 0x7e;
      *pKVar9 = (Kit_DsdObj_t)((uint)*pKVar9 & 0xfc03ffff | (int)*pKVar9 + 0x40000U & 0x3fc0000);
      *(ushort *)&pObj[1].field_0x2 = SUB42(*pKVar10,0) * 2 & 0x7e;
      pPar = (unsigned_short *)&pObj[1].field_0x2;
      *pKVar10 = (Kit_DsdObj_t)((uint)*pKVar10 & 0xfc03ffff | (int)*pKVar10 + 0x40000U & 0x3fc0000);
      Kit_DsdDecompose_rec(pNtk,pKVar9,uVar25,(unsigned_short *)pPar_00,nDecMux);
      pObj = pKVar10;
    }
    else {
LAB_005d1d58:
      KVar1 = *pObj;
      *pObj = (Kit_DsdObj_t)((uint)KVar1 | 0x200);
      if (0x3ffffff < (uint)KVar1) {
        lVar18 = (long)(iVar22 * 2);
        pOut_00 = puVar8 + lVar18;
        lVar16 = (long)iVar27;
        pOut_01 = puVar8 + lVar16;
        lVar23 = (long)(iVar22 << 2);
        pOut_03 = puVar8 + lVar23;
        lVar30 = (long)iVar5;
        pOut_02 = puVar8 + lVar30;
        uVar4 = (uint)KVar1 >> 0x1a;
        do {
          uVar25 = uVar4 - 1;
          iVar5 = Kit_TruthVarInSupport(pTruth,(uint)*pObj >> 0x1a,uVar25);
          if (iVar5 == 0) {
            __assert_fail("Kit_TruthVarInSupport( pTruth, pObj->nFans, i )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                          ,0x83b,
                          "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                         );
          }
          Kit_TruthCofactor0New(puVar8,pTruth,(uint)*pObj >> 0x1a,uVar25);
          Kit_TruthCofactor1New(pOut,pTruth,(uint)*pObj >> 0x1a,uVar25);
          uVar28 = Kit_TruthSupport(puVar8,(uint)*pObj >> 0x1a);
          uVar6 = Kit_TruthSupport(pOut,(uint)*pObj >> 0x1a);
          if (local_c0 != (uVar28 | 1 << (uVar25 & 0x1f) | uVar6)) {
            __assert_fail("uSupp == (uSupp0 | uSupp1 | (1<<i))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                          ,0x842,
                          "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                         );
          }
          if ((uVar28 == 0) || (uVar6 == 0)) {
            pObj->field_0x1 = pObj->field_0x1 & 0xfd;
            goto LAB_005d19cf;
          }
          uVar15 = ~uVar6 & uVar28;
          uVar21 = (uVar15 >> 1 & 0x55555555) + (uVar15 & 0x55555555);
          uVar21 = (uVar21 >> 2 & 0x33333333) + (uVar21 & 0x33333333);
          uVar21 = (uVar21 >> 4 & 0x7070707) + (uVar21 & 0x7070707);
          uVar21 = (uVar21 >> 8 & 0xf000f) + (uVar21 & 0xf000f);
          if (((uVar21 >> 0x10) + (uVar21 & 0xff) == 1) &&
             (uVar6 = uVar6 & ~uVar28, uVar28 = (uVar6 >> 1 & 0x55555555) + (uVar6 & 0x55555555),
             uVar28 = (uVar28 >> 2 & 0x33333333) + (uVar28 & 0x33333333),
             uVar28 = (uVar28 >> 4 & 0x7070707) + (uVar28 & 0x7070707),
             uVar28 = (uVar28 >> 8 & 0xf000f) + (uVar28 & 0xf000f),
             (uVar28 >> 0x10) + (uVar28 & 0xff) == 1)) {
            uVar28 = 0;
            do {
              if ((uVar15 >> (uVar28 & 0x1f) & 1) != 0) goto LAB_005d1f68;
              uVar28 = uVar28 + 1;
            } while (uVar28 != 0x20);
            uVar28 = 0xffffffff;
LAB_005d1f68:
            uVar15 = 0;
            do {
              if ((uVar6 >> (uVar15 & 0x1f) & 1) != 0) goto LAB_005d1f7b;
              uVar15 = uVar15 + 1;
            } while (uVar15 != 0x20);
            uVar15 = 0xffffffff;
LAB_005d1f7b:
            Kit_TruthCofactor0New(pOut_00,puVar8,(uint)*pObj >> 0x1a,uVar28);
            Kit_TruthCofactor1New(pOut_01,puVar8,(uint)*pObj >> 0x1a,uVar28);
            Kit_TruthCofactor0New(pOut_03,pOut,(uint)*pObj >> 0x1a,uVar15);
            Kit_TruthCofactor1New(pOut_02,pOut,(uint)*pObj >> 0x1a,uVar15);
            uVar37 = (ulong)(uint)(1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f));
            uVar29 = uVar37;
            if ((uint)*pObj < 0x18000000) {
              uVar37 = 1;
              uVar29 = uVar37;
            }
            do {
              iVar5 = (int)uVar37;
              uVar24 = uVar29;
              if (iVar5 < 1) break;
              lVar2 = uVar37 - 1;
              lVar3 = uVar37 - 1;
              uVar37 = uVar37 - 1;
            } while (puVar8[lVar18 + lVar2] == puVar8[lVar23 + lVar3]);
            do {
              iVar27 = (int)uVar24;
              uVar37 = uVar29;
              if (iVar27 < 1) break;
              lVar2 = uVar24 - 1;
              lVar3 = uVar24 - 1;
              uVar24 = uVar24 - 1;
            } while (puVar8[lVar16 + lVar2] == puVar8[lVar30 + lVar3]);
            do {
              iVar22 = (int)uVar37;
              if (iVar22 < 1) break;
              lVar2 = uVar37 - 1;
              lVar3 = uVar37 - 1;
              uVar37 = uVar37 - 1;
            } while (puVar8[lVar18 + lVar2] == puVar8[lVar30 + lVar3]);
            do {
              iVar7 = (int)uVar29;
              if (iVar7 < 1) break;
              lVar2 = uVar29 - 1;
              lVar3 = uVar29 - 1;
              uVar29 = uVar29 - 1;
            } while (puVar8[lVar16 + lVar2] == puVar8[lVar23 + lVar3]);
            if ((iVar5 < 1 && iVar27 < 1) || (iVar22 < 1 && iVar7 < 1)) goto LAB_005d243c;
          }
          uVar6 = (uint)*pObj >> 0x1a;
          uVar28 = uVar4;
          if (uVar4 < uVar6) {
            do {
              Kit_TruthCofactor0New(pOut_00,puVar8,uVar6,uVar28);
              Kit_TruthCofactor1New(pOut_01,puVar8,(uint)*pObj >> 0x1a,uVar28);
              Kit_TruthCofactor0New(pOut_03,pOut,(uint)*pObj >> 0x1a,uVar28);
              Kit_TruthCofactor1New(pOut_02,pOut,(uint)*pObj >> 0x1a,uVar28);
              uVar37 = (ulong)(uint)(1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f));
              uVar29 = uVar37;
              if ((uint)*pObj < 0x18000000) {
                uVar37 = 1;
                uVar29 = uVar37;
              }
              do {
                iVar5 = (int)uVar37;
                uVar24 = uVar29;
                if (iVar5 < 1) {
                  iVar27 = -3;
                  goto LAB_005d217c;
                }
                lVar2 = uVar37 - 1;
                lVar3 = uVar37 - 1;
                uVar37 = uVar37 - 1;
              } while (puVar8[lVar18 + lVar2] == puVar8[lVar16 + lVar3]);
              iVar27 = -4;
LAB_005d217c:
              do {
                iVar22 = (int)uVar24;
                uVar37 = uVar29;
                if (iVar22 < 1) {
                  iVar7 = 1;
                  goto LAB_005d21a0;
                }
                lVar2 = uVar24 - 1;
                lVar3 = uVar24 - 1;
                uVar24 = uVar24 - 1;
              } while (puVar8[lVar18 + lVar2] == puVar8[lVar23 + lVar3]);
              iVar7 = 0;
LAB_005d21a0:
              do {
                iVar19 = (int)uVar37;
                uVar24 = uVar29;
                if (iVar19 < 1) {
                  iVar20 = 1;
                  goto LAB_005d21c9;
                }
                lVar2 = uVar37 - 1;
                lVar3 = uVar37 - 1;
                uVar37 = uVar37 - 1;
              } while (puVar8[lVar18 + lVar2] == puVar8[lVar30 + lVar3]);
              iVar20 = 0;
LAB_005d21c9:
              do {
                iVar31 = (int)uVar24;
                uVar37 = uVar29;
                if (iVar31 < 1) {
                  local_68 = 1;
                  goto LAB_005d21f6;
                }
                lVar2 = uVar24 - 1;
                lVar3 = uVar24 - 1;
                uVar24 = uVar24 - 1;
              } while (puVar8[lVar16 + lVar2] == puVar8[lVar23 + lVar3]);
              local_68 = 0;
LAB_005d21f6:
              do {
                iVar32 = (int)uVar37;
                if (iVar32 < 1) {
                  iVar33 = 1;
                  goto LAB_005d221e;
                }
                lVar2 = uVar37 - 1;
                lVar3 = uVar37 - 1;
                uVar37 = uVar37 - 1;
              } while (puVar8[lVar16 + lVar2] == puVar8[lVar30 + lVar3]);
              iVar33 = 0;
LAB_005d221e:
              do {
                if ((int)uVar29 < 1) {
                  iVar34 = 1;
                  goto LAB_005d2241;
                }
                lVar2 = uVar29 - 1;
                lVar3 = uVar29 - 1;
                uVar29 = uVar29 - 1;
              } while (puVar8[lVar23 + lVar2] == puVar8[lVar30 + lVar3]);
              iVar34 = 0;
LAB_005d2241:
              if (0xfffffffd < (uint)(iVar20 + local_68 + iVar27 + iVar7 + iVar33 + iVar34)) {
                pKVar9 = Kit_DsdObjAlloc(pNtk,KIT_DSD_AND,2);
                KVar1 = *pKVar9;
                *pKVar9 = (Kit_DsdObj_t)
                          (((int)KVar1 + 0x40000U & 0x3fc0000) + ((uint)KVar1 & 0x3ffff) + 0x8000000
                          );
                *(unsigned_short *)(pKVar9 + 1) =
                     *(unsigned_short *)((long)&pPar_00->field_0x0 + (ulong)uVar28 * 2);
                *(ushort *)((long)&pPar_00->field_0x0 + (ulong)uVar28 * 2) = KVar1._0_2_ * 2 & 0x7e;
                *(unsigned_short *)&pKVar9[1].field_0x2 =
                     *(unsigned_short *)((long)&pPar_00->field_0x0 + (ulong)uVar25 * 2);
                *(unsigned_short *)((long)&pPar_00->field_0x0 + (ulong)uVar25 * 2) = 0x7f;
                local_c0 = local_c0 & ~(1 << ((byte)uVar25 & 0x1f));
                if ((iVar5 < 1 || iVar22 < 1) || iVar19 < 1) {
                  if ((iVar5 < 1 || iVar31 < 1) || iVar32 < 1) {
                    if (((char)local_68 == '\0' && (char)iVar34 == '\0') && 0 < iVar22) {
                      *(byte *)(pKVar9 + 1) = *(byte *)(pKVar9 + 1) ^ 1;
                      uVar4 = (uint)*pObj >> 0x1a;
                    }
                    else {
                      if (((char)iVar34 != '\0' || (char)iVar33 != '\0') || iVar19 < 1) {
                        if ((0 < iVar19) || (0 < iVar31)) {
                          __assert_fail("fPairs[0][3] && fPairs[1][2]",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                                        ,0x8ab,
                                        "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                                       );
                        }
                        *pKVar9 = (Kit_DsdObj_t)((uint)*pKVar9 & 0xfffffe3f | 0x100);
                        goto LAB_005d23d8;
                      }
                      uVar4 = (uint)*pObj >> 0x1a;
                      pOut_03 = pOut_02;
                    }
                  }
                  else {
                    pKVar9[1].field_0x2 = pKVar9[1].field_0x2 ^ 1;
LAB_005d23d8:
                    uVar4 = (uint)*pObj >> 0x1a;
                    pOut_03 = pOut_01;
                  }
                  Kit_TruthMuxVar(pTruth,pOut_00,pOut_03,uVar4,uVar28);
                }
                else {
                  *(byte *)(pKVar9 + 1) = *(byte *)(pKVar9 + 1) ^ 1;
                  pKVar9[1].field_0x2 = pKVar9[1].field_0x2 ^ 1;
                  Kit_TruthMuxVar(pTruth,pOut_02,pOut_00,(uint)*pObj >> 0x1a,uVar28);
                }
                goto LAB_005d19cf;
              }
              uVar28 = uVar28 + 1;
              uVar6 = (uint)*pObj >> 0x1a;
            } while (uVar28 < uVar6);
          }
          bVar38 = (int)uVar4 < 2;
          uVar4 = uVar25;
          if (bVar38) break;
        } while( true );
      }
      if ((nDecMux < 1) || ((int)((uint)*pObj >> 0x1a) <= nDecMux)) {
        return;
      }
      iVar5 = Kit_TruthBestCofVar(pTruth,(uint)*pObj >> 0x1a,puVar8,pOut);
      uVar4 = Kit_TruthSupport(puVar8,(uint)*pObj >> 0x1a);
      uSupp = Kit_TruthSupport(pOut,(uint)*pObj >> 0x1a);
      pKVar9 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      pKVar10 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,(uint)*pObj >> 0x1a);
      if ((uint)*pObj < 0x4000000) {
        uVar37 = (ulong)((uint)*pObj >> 0x1a);
        bVar38 = true;
      }
      else {
        uVar29 = 0;
        do {
          uVar26 = *(undefined2 *)((long)&pObj[1].field_0x0 + uVar29 * 2);
          *(undefined2 *)(&pKVar10[1].field_0x0 + uVar29 * 2) = uVar26;
          *(undefined2 *)(&pKVar9[1].field_0x0 + uVar29 * 2) = uVar26;
          uVar29 = uVar29 + 1;
          uVar37 = (ulong)((uint)*pObj >> 0x1a);
        } while (uVar29 < uVar37);
        bVar38 = (uint)*pObj < 0x18000000;
      }
      puVar11 = &pKVar9[1].field_0x0 + ((uint)*pKVar9 >> 8 & 0x3fc);
      if (((uint)*pKVar9 & 0x1c0) != 0x140) {
        puVar11 = (undefined1 *)0x0;
      }
      uVar25 = 1 << ((char)uVar37 - 5U & 0x1f);
      if (bVar38) {
        uVar25 = 1;
      }
      if (0 < (int)uVar25) {
        lVar18 = (ulong)uVar25 + 1;
        do {
          *(uint *)(puVar11 + lVar18 * 4 + -8) = puVar8[lVar18 + -2];
          lVar18 = lVar18 + -1;
        } while (1 < lVar18);
      }
      puVar11 = &pKVar10[1].field_0x0 + ((uint)*pKVar10 >> 8 & 0x3fc);
      if (((uint)*pKVar10 & 0x1c0) != 0x140) {
        puVar11 = (undefined1 *)0x0;
      }
      uVar25 = 1 << ((SUB41(*pObj,3) >> 2) - 5 & 0x1f);
      if ((uint)*pObj < 0x18000000) {
        uVar25 = 1;
      }
      if (0 < (int)uVar25) {
        lVar18 = (ulong)uVar25 + 1;
        do {
          *(uint *)(puVar11 + lVar18 * 4 + -8) = pOut[lVar18 + -2];
          lVar18 = lVar18 + -1;
        } while (1 < lVar18);
      }
      KVar1 = *pObj;
      if (((uint)KVar1 & 0x1c0) != 0x140) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x8c3,
                      "void Kit_DsdDecompose_rec(Kit_DsdNtk_t *, Kit_DsdObj_t *, unsigned int, unsigned short *, int)"
                     );
      }
      *pTruth = 0xcacacaca;
      *pObj = (Kit_DsdObj_t)((uint)KVar1 & 0x3ffff7f | 0xc000000);
      *(undefined2 *)(pObj + 2) = *(undefined2 *)((long)&pObj[1].field_0x0 + (long)iVar5 * 2);
      *(ushort *)(pObj + 1) = SUB42(*pKVar9,0) * 2 & 0x7e;
      *pKVar9 = (Kit_DsdObj_t)((uint)*pKVar9 & 0xfc03ffff | (int)*pKVar9 + 0x40000U & 0x3fc0000);
      *(ushort *)&pObj[1].field_0x2 = SUB42(*pKVar10,0) * 2 & 0x7e;
      pPar = (unsigned_short *)&pObj[1].field_0x2;
      *pKVar10 = (Kit_DsdObj_t)((uint)*pKVar10 & 0xfc03ffff | (int)*pKVar10 + 0x40000U & 0x3fc0000);
      Kit_DsdDecompose_rec(pNtk,pKVar9,uVar4,(unsigned_short *)pPar_00,nDecMux);
      pObj = pKVar10;
    }
  } while( true );
LAB_005d243c:
  pKVar9 = Kit_DsdObjAlloc(pNtk,KIT_DSD_PRIME,3);
  KVar1 = *pKVar9;
  puVar17 = (undefined4 *)(&pKVar9[1].field_0x0 + ((uint)KVar1 >> 8 & 0x3fc));
  if (((uint)KVar1 & 0x1c0) != 0x140) {
    puVar17 = (undefined4 *)0x0;
  }
  *puVar17 = 0xcacacaca;
  *pKVar9 = (Kit_DsdObj_t)
            (((uint)KVar1 & 0x3ffff) + ((int)KVar1 + 0x40000U & 0x3fc0000) + 0xc000000);
  *(undefined2 *)(pKVar9 + 1) = *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)uVar28 * 2);
  *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)uVar28 * 2) = 0x7f;
  *(undefined2 *)&pKVar9[1].field_0x2 =
       *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)uVar15 * 2);
  *(undefined2 *)((long)&pObj[1].field_0x0 + (long)(int)uVar15 * 2) = 0x7f;
  local_c0 = local_c0 & ~(1 << ((byte)uVar15 & 0x1f) | 1 << (uVar28 & 0x1f));
  *(undefined2 *)(pKVar9 + 2) = *(undefined2 *)((long)&pObj[1].field_0x0 + (ulong)uVar25 * 2);
  *(ushort *)((long)&pObj[1].field_0x0 + (ulong)uVar25 * 2) = SUB42(*pKVar9,0) * 2 & 0x7e;
  Kit_TruthMuxVar(pTruth,pOut_03,pOut_02,(uint)*pObj >> 0x1a,uVar25);
  if (iVar22 < 1 && iVar7 < 1) {
    *(byte *)(pKVar9 + 1) = *(byte *)(pKVar9 + 1) ^ 1;
  }
  goto LAB_005d19cf;
}

Assistant:

void Kit_DsdDecompose_rec( Kit_DsdNtk_t * pNtk, Kit_DsdObj_t * pObj, unsigned uSupp, unsigned short * pPar, int nDecMux )
{
    Kit_DsdObj_t * pRes, * pRes0, * pRes1;
    int nWords = Kit_TruthWordNum(pObj->nFans);
    unsigned * pTruth = Kit_DsdObjTruth(pObj);
    unsigned * pCofs2[2] = { pNtk->pMem, pNtk->pMem + nWords };
    unsigned * pCofs4[2][2] = { {pNtk->pMem + 2 * nWords, pNtk->pMem + 3 * nWords}, {pNtk->pMem + 4 * nWords, pNtk->pMem + 5 * nWords} };
    int i, iLit0, iLit1, nFans0, nFans1, nPairs;
    int fEquals[2][2], fOppos, fPairs[4][4];
    unsigned j, k, nFansNew, uSupp0, uSupp1;

    assert( pObj->nFans > 0 );
    assert( pObj->Type == KIT_DSD_PRIME );
    assert( uSupp == (uSupp0 = (unsigned)Kit_TruthSupport(pTruth, pObj->nFans)) );

    // compress the truth table
    if ( uSupp != Kit_BitMask(pObj->nFans) )
    {
        nFansNew = Kit_WordCountOnes(uSupp);
        Kit_TruthShrink( pNtk->pMem, pTruth, nFansNew, pObj->nFans, uSupp, 1 );
        for ( j = k = 0; j < pObj->nFans; j++ )
            if ( uSupp & (1 << j) )
                pObj->pFans[k++] = pObj->pFans[j];
        assert( k == nFansNew );
        pObj->nFans = k;
        uSupp = Kit_BitMask(pObj->nFans);
    }

    // consider the single variable case
    if ( pObj->nFans == 1 )
    {
        pObj->Type = KIT_DSD_NONE;
        if ( pTruth[0] == 0x55555555 )
            pObj->pFans[0] = Abc_LitNot(pObj->pFans[0]);
        else
            assert( pTruth[0] == 0xAAAAAAAA );
        // update the parent pointer
        *pPar = Abc_LitNotCond( pObj->pFans[0], Abc_LitIsCompl(*pPar) );
        return;
    }

    // decompose the output
    if ( !pObj->fMark )
    for ( i = pObj->nFans - 1; i >= 0; i-- )
    {
        // get the two-variable cofactors
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pObj->nFans, i );
        Kit_TruthCofactor1New( pCofs2[1], pTruth, pObj->nFans, i );
//        assert( !Kit_TruthVarInSupport( pCofs2[0], pObj->nFans, i) );
//        assert( !Kit_TruthVarInSupport( pCofs2[1], pObj->nFans, i) );
        // get the constant cofs
        fEquals[0][0] = Kit_TruthIsConst0( pCofs2[0], pObj->nFans );
        fEquals[0][1] = Kit_TruthIsConst0( pCofs2[1], pObj->nFans );
        fEquals[1][0] = Kit_TruthIsConst1( pCofs2[0], pObj->nFans );
        fEquals[1][1] = Kit_TruthIsConst1( pCofs2[1], pObj->nFans );
        fOppos        = Kit_TruthIsOpposite( pCofs2[0], pCofs2[1], pObj->nFans );
        assert( !Kit_TruthIsEqual(pCofs2[0], pCofs2[1], pObj->nFans) );
        if ( fEquals[0][0] + fEquals[0][1] + fEquals[1][0] + fEquals[1][1] + fOppos == 0 )
        {
            // check the MUX decomposition
            uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
            uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
            assert( uSupp == (uSupp0 | uSupp1 | (1<<i)) );
            if ( uSupp0 & uSupp1 )
                continue;
            // perform MUX decomposition
            pRes0 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
            pRes1 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
            for ( k = 0; k < pObj->nFans; k++ )
            {
                pRes0->pFans[k] = (uSupp0 & (1 << k))? pObj->pFans[k] : 127;
                pRes1->pFans[k] = (uSupp1 & (1 << k))? pObj->pFans[k] : 127;
            }
            Kit_TruthCopy( Kit_DsdObjTruth(pRes0), pCofs2[0], pObj->nFans );        
            Kit_TruthCopy( Kit_DsdObjTruth(pRes1), pCofs2[1], pObj->nFans ); 
            // update the current one
            assert( pObj->Type == KIT_DSD_PRIME );
            pTruth[0] = 0xCACACACA;
            pObj->nFans = 3;
            pObj->pFans[2] = pObj->pFans[i];
            pObj->pFans[0] = 2*pRes0->Id; pRes0->nRefs++;
            pObj->pFans[1] = 2*pRes1->Id; pRes1->nRefs++;
            // call recursively
            Kit_DsdDecompose_rec( pNtk, pRes0, uSupp0, pObj->pFans + 0, nDecMux );
            Kit_DsdDecompose_rec( pNtk, pRes1, uSupp1, pObj->pFans + 1, nDecMux );
            return;
        }

        // create the new node
        pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_AND, 2 );
        pRes->nRefs++;
        pRes->nFans = 2;
        pRes->pFans[0] = pObj->pFans[i];  pObj->pFans[i] = 127;  uSupp &= ~(1 << i);
        pRes->pFans[1] = 2*pObj->Id;
        // update the parent pointer
        *pPar = Abc_LitNotCond( 2 * pRes->Id, Abc_LitIsCompl(*pPar) );
        // consider different decompositions
        if ( fEquals[0][0] )
        {
            Kit_TruthCopy( pTruth, pCofs2[1], pObj->nFans );
        }
        else if ( fEquals[0][1] )
        {
            pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else if ( fEquals[1][0] )
        {
            *pPar = Abc_LitNot(*pPar);
            pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
            Kit_TruthCopy( pTruth, pCofs2[1], pObj->nFans );
        }
        else if ( fEquals[1][1] )
        {
            *pPar = Abc_LitNot(*pPar);
            pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
            pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else if ( fOppos )
        {
            pRes->Type = KIT_DSD_XOR;
            Kit_TruthCopy( pTruth, pCofs2[0], pObj->nFans );
        }
        else
            assert( 0 );
        // decompose the remainder
        assert( Kit_DsdObjTruth(pObj) == pTruth );
        Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pRes->pFans + 1, nDecMux );
        return;
    }
    pObj->fMark = 1;

    // decompose the input
    for ( i = pObj->nFans - 1; i >= 0; i-- )
    {
        assert( Kit_TruthVarInSupport( pTruth, pObj->nFans, i ) );
        // get the single variale cofactors
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pObj->nFans, i );
        Kit_TruthCofactor1New( pCofs2[1], pTruth, pObj->nFans, i );
        // check the existence of MUX decomposition
        uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
        uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
        assert( uSupp == (uSupp0 | uSupp1 | (1<<i)) );
        // if one of the cofs is a constant, it is time to check the output again
        if ( uSupp0 == 0 || uSupp1 == 0 )
        {
            pObj->fMark = 0;
            Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
            return;
        }
        assert( uSupp0 && uSupp1 );
        // get the number of unique variables
        nFans0 = Kit_WordCountOnes( uSupp0 & ~uSupp1 );
        nFans1 = Kit_WordCountOnes( uSupp1 & ~uSupp0 );
        if ( nFans0 == 1 && nFans1 == 1 )
        {
            // get the cofactors w.r.t. the unique variables
            iLit0 = Kit_WordFindFirstBit( uSupp0 & ~uSupp1 );
            iLit1 = Kit_WordFindFirstBit( uSupp1 & ~uSupp0 );
            // get four cofactors                                        
            Kit_TruthCofactor0New( pCofs4[0][0], pCofs2[0], pObj->nFans, iLit0 );
            Kit_TruthCofactor1New( pCofs4[0][1], pCofs2[0], pObj->nFans, iLit0 );
            Kit_TruthCofactor0New( pCofs4[1][0], pCofs2[1], pObj->nFans, iLit1 );
            Kit_TruthCofactor1New( pCofs4[1][1], pCofs2[1], pObj->nFans, iLit1 );
            // check existence conditions
            fEquals[0][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][0], pObj->nFans );
            fEquals[0][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][1], pObj->nFans );
            fEquals[1][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][1], pObj->nFans );
            fEquals[1][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][0], pObj->nFans );
            if ( (fEquals[0][0] && fEquals[0][1]) || (fEquals[1][0] && fEquals[1][1]) )
            {
                // construct the MUX
                pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, 3 );
                Kit_DsdObjTruth(pRes)[0] = 0xCACACACA;
                pRes->nRefs++;
                pRes->nFans = 3;
                pRes->pFans[0] = pObj->pFans[iLit0]; pObj->pFans[iLit0] = 127;  uSupp &= ~(1 << iLit0);
                pRes->pFans[1] = pObj->pFans[iLit1]; pObj->pFans[iLit1] = 127;  uSupp &= ~(1 << iLit1);
                pRes->pFans[2] = pObj->pFans[i];     pObj->pFans[i] = 2 * pRes->Id; // remains in support
                // update the node
//                if ( fEquals[0][0] && fEquals[0][1] )
//                    Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, i );
//                else
//                    Kit_TruthMuxVar( pTruth, pCofs4[0][1], pCofs4[0][0], pObj->nFans, i );
                Kit_TruthMuxVar( pTruth, pCofs4[1][0], pCofs4[1][1], pObj->nFans, i );
                if ( fEquals[1][0] && fEquals[1][1] )
                    pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);
                // decompose the remainder
                Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
                return;
            }
        }

        // try other inputs
        for ( k = i+1; k < pObj->nFans; k++ )
        {
            // get four cofactors                                                ik
            Kit_TruthCofactor0New( pCofs4[0][0], pCofs2[0], pObj->nFans, k ); // 00 
            Kit_TruthCofactor1New( pCofs4[0][1], pCofs2[0], pObj->nFans, k ); // 01 
            Kit_TruthCofactor0New( pCofs4[1][0], pCofs2[1], pObj->nFans, k ); // 10 
            Kit_TruthCofactor1New( pCofs4[1][1], pCofs2[1], pObj->nFans, k ); // 11 
            // compare equal pairs
            fPairs[0][1] = fPairs[1][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[0][1], pObj->nFans );
            fPairs[0][2] = fPairs[2][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][0], pObj->nFans );
            fPairs[0][3] = fPairs[3][0] = Kit_TruthIsEqual( pCofs4[0][0], pCofs4[1][1], pObj->nFans );
            fPairs[1][2] = fPairs[2][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][0], pObj->nFans );
            fPairs[1][3] = fPairs[3][1] = Kit_TruthIsEqual( pCofs4[0][1], pCofs4[1][1], pObj->nFans );
            fPairs[2][3] = fPairs[3][2] = Kit_TruthIsEqual( pCofs4[1][0], pCofs4[1][1], pObj->nFans );
            nPairs = fPairs[0][1] + fPairs[0][2] + fPairs[0][3] + fPairs[1][2] + fPairs[1][3] + fPairs[2][3];
            if ( nPairs != 3 && nPairs != 2 )
                continue;

            // decomposition exists
            pRes = Kit_DsdObjAlloc( pNtk, KIT_DSD_AND, 2 );
            pRes->nRefs++;
            pRes->nFans = 2;
            pRes->pFans[0] = pObj->pFans[k]; pObj->pFans[k] = 2 * pRes->Id;  // remains in support
            pRes->pFans[1] = pObj->pFans[i]; pObj->pFans[i] = 127;       uSupp &= ~(1 << i);
            if ( !fPairs[0][1] && !fPairs[0][2] && !fPairs[0][3] ) // 00
            {
                pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
                pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);
                Kit_TruthMuxVar( pTruth, pCofs4[1][1], pCofs4[0][0], pObj->nFans, k );
            }
            else if ( !fPairs[1][0] && !fPairs[1][2] && !fPairs[1][3] ) // 01
            {
                pRes->pFans[1] = Abc_LitNot(pRes->pFans[1]);  
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, k );
            }
            else if ( !fPairs[2][0] && !fPairs[2][1] && !fPairs[2][3] ) // 10
            {
                pRes->pFans[0] = Abc_LitNot(pRes->pFans[0]);  
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[1][0], pObj->nFans, k );
            }
            else if ( !fPairs[3][0] && !fPairs[3][1] && !fPairs[3][2] ) // 11
            {
//                unsigned uSupp0 = Kit_TruthSupport(pCofs4[0][0], pObj->nFans);
//                unsigned uSupp1 = Kit_TruthSupport(pCofs4[1][1], pObj->nFans);
//                unsigned uSupp;
//                Extra_PrintBinary( stdout, &uSupp0, pObj->nFans ); printf( "\n" );
//                Extra_PrintBinary( stdout, &uSupp1, pObj->nFans ); printf( "\n" );
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[1][1], pObj->nFans, k );
//                uSupp = Kit_TruthSupport(pTruth, pObj->nFans);
//                Extra_PrintBinary( stdout, &uSupp, pObj->nFans ); printf( "\n" ); printf( "\n" );
            }
            else
            {
                assert( fPairs[0][3] && fPairs[1][2] );
                pRes->Type = KIT_DSD_XOR;;
                Kit_TruthMuxVar( pTruth, pCofs4[0][0], pCofs4[0][1], pObj->nFans, k );
            }
            // decompose the remainder
            Kit_DsdDecompose_rec( pNtk, pObj, uSupp, pPar, nDecMux );
            return;
        }
    }

    // if all decomposition methods failed and we are still above the limit, perform MUX-decomposition
    if ( nDecMux > 0 && (int)pObj->nFans > nDecMux )
    {
        int iBestVar = Kit_TruthBestCofVar( pTruth, pObj->nFans, pCofs2[0], pCofs2[1] );
        uSupp0 = Kit_TruthSupport( pCofs2[0], pObj->nFans );
        uSupp1 = Kit_TruthSupport( pCofs2[1], pObj->nFans );
        // perform MUX decomposition
        pRes0 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
        pRes1 = Kit_DsdObjAlloc( pNtk, KIT_DSD_PRIME, pObj->nFans );
        for ( k = 0; k < pObj->nFans; k++ )
            pRes0->pFans[k] = pRes1->pFans[k] = pObj->pFans[k];
        Kit_TruthCopy( Kit_DsdObjTruth(pRes0), pCofs2[0], pObj->nFans );        
        Kit_TruthCopy( Kit_DsdObjTruth(pRes1), pCofs2[1], pObj->nFans ); 
        // update the current one
        assert( pObj->Type == KIT_DSD_PRIME );
        pTruth[0] = 0xCACACACA;
        pObj->nFans = 3;
        pObj->pFans[2] = pObj->pFans[iBestVar];
        pObj->pFans[0] = 2*pRes0->Id; pRes0->nRefs++;
        pObj->pFans[1] = 2*pRes1->Id; pRes1->nRefs++;
        // call recursively
        Kit_DsdDecompose_rec( pNtk, pRes0, uSupp0, pObj->pFans + 0, nDecMux );
        Kit_DsdDecompose_rec( pNtk, pRes1, uSupp1, pObj->pFans + 1, nDecMux );
    }

}